

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

uint64_t sum_quotients<unsigned_short,libdivide::divider<unsigned_short,(libdivide::Branching)0>>
                   (random_numerators<unsigned_short> *vals,
                   divider<unsigned_short,_(libdivide::Branching)0> *div)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  random_numerators<unsigned_short> *this;
  random_numerators<unsigned_short> *prVar4;
  ushort *in_RSI;
  random_numerators<unsigned_short> *in_RDI;
  const_iterator iter;
  UIntT sum;
  uint16_t t;
  uint16_t q;
  uint32_t rl;
  uint32_t yl;
  uint32_t xl;
  random_numerators<unsigned_short> *prVar5;
  ushort local_62;
  short local_12;
  
  local_62 = 0;
  this = (random_numerators<unsigned_short> *)random_numerators<unsigned_short>::begin(in_RDI);
  while( true ) {
    prVar5 = this;
    prVar4 = (random_numerators<unsigned_short> *)random_numerators<unsigned_short>::end(this);
    if (this == prVar4) break;
    uVar2 = *(ushort *)&prVar5->_pData;
    bVar1 = (byte)in_RSI[1];
    if (*in_RSI == 0) {
      local_12 = (short)((int)(uint)uVar2 >> (bVar1 & 0x1f));
    }
    else {
      uVar3 = (ushort)((uint)uVar2 * (uint)*in_RSI >> 0x10);
      if ((bVar1 & 0x40) == 0) {
        local_12 = (short)((int)(uint)uVar3 >> (bVar1 & 0x1f));
      }
      else {
        local_12 = (short)((int)(uint)(ushort)((short)((int)((uint)uVar2 - (uint)uVar3) >> 1) +
                                              uVar3) >> (bVar1 & 0x1f));
      }
    }
    local_62 = local_62 + local_12;
    this = (random_numerators<unsigned_short> *)((long)&prVar5->_pData + 2);
  }
  return (ulong)local_62;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}